

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tables.cpp
# Opt level: O2

void __thiscall MT32Emu::Tables::Tables(Tables *this)

{
  Bit8u BVar1;
  int iVar2;
  Bit8u *pBVar3;
  int lf;
  long lVar4;
  float fVar5;
  double dVar6;
  
  for (lVar4 = 0; lVar4 != 0x65; lVar4 = lVar4 + 1) {
    dVar6 = log10((double)((float)(int)lVar4 + 1.0));
    iVar2 = (int)((2.0 - (float)dVar6) * 128.0 + 1.0);
    BVar1 = (Bit8u)iVar2;
    if (0xfe < iVar2) {
      BVar1 = 0xff;
    }
    this->levelToAmpSubtraction[lVar4] = BVar1;
  }
  this->envLogarithmicTime[0] = '@';
  for (lVar4 = -0xff; lVar4 != 0; lVar4 = lVar4 + 1) {
    fVar5 = LOG2F((float)((int)lVar4 + 0x100));
    fVar5 = ceilf(fVar5 * 8.0 + 64.0);
    this->masterVolToAmpSubtraction[lVar4] = (Bit8u)(int)fVar5;
  }
  this->masterVolToAmpSubtraction[0] = 0xff;
  for (lVar4 = -100; lVar4 != 0; lVar4 = lVar4 + 1) {
    fVar5 = LOG2F((float)((int)lVar4 + 0x65));
    this->pulseWidth100To255[lVar4] = (Bit8u)(int)(fVar5 * -16.0 + 106.31);
  }
  pBVar3 = this->pulseWidth100To255;
  for (lVar4 = 0; lVar4 != 0x649b; lVar4 = lVar4 + 0xff) {
    *pBVar3 = (Bit8u)(int)((float)(int)lVar4 / 100.0 + 0.5);
    pBVar3 = pBVar3 + 1;
  }
  iVar2 = -1;
  for (lVar4 = 0; lVar4 != 0x200; lVar4 = lVar4 + 1) {
    dVar6 = exp((double)(((float)iVar2 * 0.001953125 + 13.0) * 0.6931472));
    this->exp9[lVar4] = (Bit16u)(int)(8191.5 - (float)dVar6);
    iVar2 = iVar2 + -1;
  }
  lVar4 = 0;
  while (lVar4 != 0x1ff) {
    dVar6 = sin((double)(((float)(int)(lVar4 + 1) + 0.5) * 0.0009765625 * 3.1415927));
    fVar5 = LOG2F((float)dVar6);
    this->logsin9[lVar4 + 1] = (Bit16u)(int)(fVar5 * -1024.0 + 0.5);
    lVar4 = lVar4 + 1;
  }
  this->logsin9[0] = 0x1fff;
  this->resAmpDecayFactor = "\x1f\x10\f\b\x05\x03\x02\x01";
  return;
}

Assistant:

Tables::Tables() {
	for (int lf = 0; lf <= 100; lf++) {
		// CONFIRMED:KG: This matches a ROM table found by Mok
		float fVal = (2.0f - LOG10F(float(lf) + 1.0f)) * 128.0f;
		int val = int(fVal + 1.0);
		if (val > 255) {
			val = 255;
		}
		levelToAmpSubtraction[lf] = Bit8u(val);
	}

	envLogarithmicTime[0] = 64;
	for (int lf = 1; lf <= 255; lf++) {
		// CONFIRMED:KG: This matches a ROM table found by Mok
		envLogarithmicTime[lf] = Bit8u(ceil(64.0f + LOG2F(float(lf)) * 8.0f));
	}

#if 0
	// The table below is to be used in conjunction with emulation of VCA of newer generation units which is currently missing.
	// These relatively small values are rather intended to fine-tune the overall amplification of the VCA.
	// CONFIRMED: Based on a table found by Mok in the LAPC-I control ROM
	// Note that this matches the MT-32 table, but with the values clamped to a maximum of 8.
	memset(masterVolToAmpSubtraction, 8, 71);
	memset(masterVolToAmpSubtraction + 71, 7, 3);
	memset(masterVolToAmpSubtraction + 74, 6, 4);
	memset(masterVolToAmpSubtraction + 78, 5, 3);
	memset(masterVolToAmpSubtraction + 81, 4, 4);
	memset(masterVolToAmpSubtraction + 85, 3, 3);
	memset(masterVolToAmpSubtraction + 88, 2, 4);
	memset(masterVolToAmpSubtraction + 92, 1, 4);
	memset(masterVolToAmpSubtraction + 96, 0, 5);
#else
	// CONFIRMED: Based on a table found by Mok in the MT-32 control ROM
	masterVolToAmpSubtraction[0] = 255;
	for (int masterVol = 1; masterVol <= 100; masterVol++) {
		masterVolToAmpSubtraction[masterVol] = Bit8u(106.31 - 16.0f * LOG2F(float(masterVol)));
	}
#endif

	for (int i = 0; i <= 100; i++) {
		pulseWidth100To255[i] = Bit8u(i * 255 / 100.0f + 0.5f);
		//synth->printDebug("%d: %d", i, pulseWidth100To255[i]);
	}

	// The LA32 chip contains an exponent table inside. The table contains 12-bit integer values.
	// The actual table size is 512 rows. The 9 higher bits of the fractional part of the argument are used as a lookup address.
	// To improve the precision of computations, the lower bits are supposed to be used for interpolation as the LA32 chip also
	// contains another 512-row table with inverted differences between the main table values.
	for (int i = 0; i < 512; i++) {
		exp9[i] = Bit16u(8191.5f - EXP2F(13.0f + ~i / 512.0f));
	}

	// There is a logarithmic sine table inside the LA32 chip. The table contains 13-bit integer values.
	for (int i = 1; i < 512; i++) {
		logsin9[i] = Bit16u(0.5f - LOG2F(sin((i + 0.5f) / 1024.0f * FLOAT_PI)) * 1024.0f);
	}

	// The very first value is clamped to the maximum possible 13-bit integer
	logsin9[0] = 8191;

	// found from sample analysis
	static const Bit8u resAmpDecayFactorTable[] = {31, 16, 12, 8, 5, 3, 2, 1};
	resAmpDecayFactor = resAmpDecayFactorTable;
}